

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DOMNodeImpl::isEqualNode(DOMNodeImpl *this,DOMNode *arg)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  DOMNode *pDVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  DOMNode *thisNode;
  DOMNode *arg_local;
  DOMNodeImpl *this_local;
  
  if (arg == (DOMNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = isSameNode(this,arg);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      pDVar4 = getContainingNode(this);
      iVar2 = (*arg->_vptr_DOMNode[4])();
      iVar3 = (*pDVar4->_vptr_DOMNode[4])();
      if (iVar2 == iVar3) {
        iVar2 = (*pDVar4->_vptr_DOMNode[2])();
        iVar3 = (*arg->_vptr_DOMNode[2])();
        bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var,iVar2),
                                  (XMLCh *)CONCAT44(extraout_var_00,iVar3));
        if (bVar1) {
          iVar2 = (*pDVar4->_vptr_DOMNode[0x18])();
          iVar3 = (*arg->_vptr_DOMNode[0x18])();
          bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_01,iVar2),
                                    (XMLCh *)CONCAT44(extraout_var_02,iVar3));
          if (bVar1) {
            iVar2 = (*pDVar4->_vptr_DOMNode[0x16])();
            iVar3 = (*arg->_vptr_DOMNode[0x16])();
            bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_03,iVar2),
                                      (XMLCh *)CONCAT44(extraout_var_04,iVar3));
            if (bVar1) {
              iVar2 = (*pDVar4->_vptr_DOMNode[0x17])();
              iVar3 = (*arg->_vptr_DOMNode[0x17])();
              bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_05,iVar2),
                                        (XMLCh *)CONCAT44(extraout_var_06,iVar3));
              if (bVar1) {
                iVar2 = (*pDVar4->_vptr_DOMNode[3])();
                iVar3 = (*arg->_vptr_DOMNode[3])();
                bVar1 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_07,iVar2),
                                          (XMLCh *)CONCAT44(extraout_var_08,iVar3));
                if (bVar1) {
                  this_local._7_1_ = true;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DOMNodeImpl::isEqualNode(const DOMNode* arg) const
{
    if (!arg)
        return false;

    if (isSameNode(arg)) {
        return true;
    }

    const DOMNode* thisNode = getContainingNode();

    if (arg->getNodeType() != thisNode->getNodeType()) {
        return false;
    }

    // the compareString will check null string as well
    if (!XMLString::equals(thisNode->getNodeName(), arg->getNodeName())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getLocalName(),arg->getLocalName())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getNamespaceURI(), arg->getNamespaceURI())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getPrefix(), arg->getPrefix())) {
        return false;
    }

    if (!XMLString::equals(thisNode->getNodeValue(), arg->getNodeValue())) {
        return false;
    }

    return true;
}